

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<crashProblems>::AddTestPattern
          (ParameterizedTestSuiteInfo<crashProblems> *this,char *param_1,char *test_base_name,
          TestMetaFactoryBase<int> *meta_factory,CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator local_61;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined8 uStack_48;
  int local_40;
  TestInfo *local_38;
  
  local_38 = (TestInfo *)operator_new(0x50);
  local_60 = (size_type *)(code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60 == paVar1) {
    local_50 = paVar1->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_60 = &local_50;
  }
  else {
    local_50 = paVar1->_M_allocated_capacity;
  }
  local_58 = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_40 = code_location->line;
  std::__cxx11::string::string((string *)local_38,test_base_name,&local_61);
  (local_38->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<int>,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
  .super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>._M_head_impl =
       meta_factory;
  paVar1 = &(local_38->code_location).file.field_2;
  (local_38->code_location).file._M_dataplus._M_p = (pointer)paVar1;
  if (local_60 == &local_50) {
    paVar1->_M_allocated_capacity = local_50;
    *(undefined8 *)((long)&(local_38->code_location).file.field_2 + 8) = uStack_48;
  }
  else {
    (local_38->code_location).file._M_dataplus._M_p = (pointer)local_60;
    (local_38->code_location).file.field_2._M_allocated_capacity = local_50;
  }
  (local_38->code_location).file._M_string_length = local_58;
  local_58 = 0;
  local_50 = local_50 & 0xffffffffffffff00;
  (local_38->code_location).line = local_40;
  local_60 = &local_50;
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<crashProblems>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<crashProblems>::TestInfo>>>
  ::emplace_back<testing::internal::ParameterizedTestSuiteInfo<crashProblems>::TestInfo*>
            ((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<crashProblems>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<crashProblems>::TestInfo>>>
              *)&this->tests_,&local_38);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  return;
}

Assistant:

void AddTestPattern(const char*,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }